

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_xlib.h
# Opt level: O3

void nk_xsurf_stroke_line
               (XSurface *surf,short x0,short y0,short x1,short y1,uint line_thickness,nk_color col)

{
  undefined8 in_RAX;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  undefined6 in_register_00000032;
  undefined6 in_register_00000082;
  undefined4 uVar1;
  
  uVar1 = (undefined4)((ulong)in_RAX >> 0x20);
  XSetForeground(surf->dpy,surf->gc,
                 (uint)col >> 0x10 & 0xff | (uint)col & 0xff00 | ((uint)col & 0xff) << 0x10);
  XSetLineAttributes(surf->dpy,surf->gc,line_thickness,0,1,0);
  XDrawLine(surf->dpy,surf->drawable,surf->gc,CONCAT62(in_register_00000032,x0) & 0xffffffff,
            CONCAT62(in_register_00000012,y0) & 0xffffffff,
            CONCAT62(in_register_0000000a,x1) & 0xffffffff,
            CONCAT44(uVar1,(int)CONCAT62(in_register_00000082,y1)));
  XSetLineAttributes(surf->dpy,surf->gc,1,0,1,0);
  return;
}

Assistant:

static void
nk_xsurf_stroke_line(XSurface *surf, short x0, short y0, short x1,
    short y1, unsigned int line_thickness, struct nk_color col)
{
    unsigned long c = nk_color_from_byte(&col.r);
    XSetForeground(surf->dpy, surf->gc, c);
    XSetLineAttributes(surf->dpy, surf->gc, line_thickness, LineSolid, CapButt, JoinMiter);
    XDrawLine(surf->dpy, surf->drawable, surf->gc, (int)x0, (int)y0, (int)x1, (int)y1);
    XSetLineAttributes(surf->dpy, surf->gc, 1, LineSolid, CapButt, JoinMiter);
}